

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void calc_similarity_from_indexer_with_references<float,unsigned_long>
               (float *numeric_data,int *categ_data,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,size_t nrows,int nthreads,bool standardize_dist,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *rmat,
               TreesIndexer *indexer,bool is_col_major,size_t ld_numeric,size_t ld_categ)

{
  pointer pSVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long *Xc_indptr_00;
  bool bVar8;
  size_t ix_1;
  size_t sVar9;
  long lVar10;
  int *piVar11;
  runtime_error *this;
  ExtIsoForest *pEVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  unsigned_long *Xc_ind_00;
  size_t ref;
  size_t sVar16;
  float *Xr_indptr;
  double *pdVar17;
  size_t ix;
  long lVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float *pfVar22;
  allocator<char> local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  int *local_1a0;
  float *local_198;
  double dStack_190;
  size_t local_180;
  SignalSwitcher ss;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  vector<unsigned_long,_std::allocator<unsigned_long>_> terminal_indices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_198 = numeric_data;
  sVar9 = get_number_of_reference_points(indexer);
  if (sVar9 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Unexpected error in ",&local_1a1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/dist.hpp"
               ,&local_1a2);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,":",&local_1a3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ignored,
                   &local_50,&local_b0);
    std::__cxx11::to_string(&local_d0,0x6c9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ignored,
                   &local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
               ,&local_1a4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &terminal_indices,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   &local_f0);
    std::runtime_error::runtime_error(this,(string *)&terminal_indices);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a0 = categ_data;
  SignalSwitcher::SignalSwitcher(&ss);
  pEVar12 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar12 = model_outputs_ext;
  }
  lVar10 = ((long)(pEVar12->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pEVar12->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&terminal_indices,lVar10 * nrows,(allocator_type *)&ignored);
  ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       operator_new__(-(ulong)(nrows >> 0x3d != 0) | nrows * 8);
  pfVar14 = (float *)0x0;
  pfVar22 = (float *)0x0;
  if (is_col_major) {
    pfVar22 = Xc;
  }
  Xc_ind_00 = (unsigned_long *)0x0;
  if (is_col_major) {
    Xc_ind_00 = Xc_ind;
  }
  Xr_indptr = (float *)Xc_indptr;
  Xc_indptr_00 = (unsigned_long *)0x0;
  if (is_col_major) {
    Xr_indptr = pfVar14;
    Xc_ind = (unsigned_long *)pfVar14;
    Xc_indptr_00 = Xc_indptr;
    Xc = pfVar14;
  }
  predict_iforest<float,unsigned_long>
            (local_198,local_1a0,is_col_major,ld_numeric,ld_categ,pfVar22,Xc_ind_00,Xc_indptr_00,Xc,
             Xc_ind,(unsigned_long *)Xr_indptr,nrows,nthreads,false,model_outputs,model_outputs_ext,
             (double *)
             ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,
             terminal_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,(double *)0x0,indexer);
  std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
            ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&ignored,(pointer)0x0);
  check_interrupt_switch(&ss);
  bVar8 = interrupt_switch;
  local_180 = sVar9 * 8;
  piVar11 = (int *)0x0;
  pdVar17 = rmat;
  while (piVar11 != (int *)nrows) {
    local_1a0 = piVar11;
    if ((bVar8 & 1U) == 0) {
      memset(rmat + (long)piVar11 * sVar9,0,local_180);
      local_198 = (float *)(terminal_indices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + (long)piVar11);
      for (lVar13 = 0; lVar13 != lVar10; lVar13 = lVar13 + 1) {
        pSVar1 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = pSVar1[lVar13].n_terminal;
        if ((uVar2 & 1) == 0) {
          lVar15 = (uVar2 - 1) * (uVar2 >> 1);
        }
        else {
          lVar15 = (uVar2 - 1 >> 1) * uVar2;
        }
        lVar3 = *(long *)&pSVar1[lVar13].reference_points.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
        lVar4 = *(long *)&pSVar1[lVar13].node_distances.
                          super__Vector_base<double,_std::allocator<double>_>;
        lVar5 = *(long *)&pSVar1[lVar13].node_depths.
                          super__Vector_base<double,_std::allocator<double>_>;
        uVar6 = *(ulong *)(local_198 + lVar13 * nrows * 2);
        for (sVar16 = 0; sVar9 != sVar16; sVar16 = sVar16 + 1) {
          uVar7 = *(ulong *)(lVar3 + sVar16 * 8);
          if (uVar6 == uVar7) {
            dVar19 = *(double *)(lVar5 + uVar6 * 8) + 3.0;
          }
          else {
            if (uVar6 < uVar7) {
              lVar18 = uVar7 + (lVar15 - uVar6) + ~(((uVar2 - uVar6) + -1) * (uVar2 - uVar6) >> 1);
            }
            else {
              lVar18 = ((uVar6 + lVar15) - uVar7) + ~(((uVar2 - uVar7) + -1) * (uVar2 - uVar7) >> 1)
              ;
            }
            dVar19 = *(double *)(lVar4 + lVar18 * 8);
          }
          pdVar17[sVar16] = dVar19 + pdVar17[sVar16];
        }
      }
    }
    pdVar17 = (double *)((long)pdVar17 + local_180);
    piVar11 = (int *)((long)local_1a0 + 1);
  }
  check_interrupt_switch(&ss);
  auVar20._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar20._0_8_ = lVar10;
  auVar20._12_4_ = 0x45300000;
  dVar19 = auVar20._8_8_ - 1.9342813113834067e+25;
  pfVar22 = (float *)(dVar19 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
  if (standardize_dist) {
    lVar10 = lVar10 * 2;
    auVar21._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar21._0_8_ = lVar10;
    auVar21._12_4_ = 0x45300000;
    local_198 = pfVar22;
    dStack_190 = dVar19;
    for (lVar13 = 0; sVar9 * nrows - lVar13 != 0; lVar13 = lVar13 + 1) {
      dVar19 = exp2(-(rmat[lVar13] - (double)local_198) /
                    ((auVar21._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)));
      rmat[lVar13] = dVar19;
    }
  }
  else {
    for (lVar10 = 0; sVar9 * nrows - lVar10 != 0; lVar10 = lVar10 + 1) {
      rmat[lVar10] = rmat[lVar10] / (double)pfVar22;
    }
  }
  check_interrupt_switch(&ss);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ignored);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&terminal_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void calc_similarity_from_indexer_with_references
(
    real_t *restrict numeric_data, int *restrict categ_data,
    real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
    size_t nrows, int nthreads, bool standardize_dist,
    IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
    double *restrict rmat,
    TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ
)
{
    size_t n_ref = get_number_of_reference_points(*indexer);
    if (unlikely(!n_ref)) unexpected_error();

    SignalSwitcher ss;

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    std::vector<sparse_ix> terminal_indices(nrows * ntrees);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.data(),
                    (double*)NULL,
                    indexer);
    ignored.reset();

    #ifndef _OPENMP
    nthreads = 1;
    #endif

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(rmat, terminal_indices, nrows, n_ref, indexer, ntrees)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        size_t i, j;
        size_t n_terminal_this;
        size_t ncomb_this;
        size_t *restrict ref_this;
        sparse_ix *restrict ind_this;
        double *restrict node_depths_this;
        double *restrict node_dist_this;
        double *rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            ref_this = indexer->indices[tree].reference_points.data();
            ind_this = terminal_indices.data() + tree*nrows;
            node_depths_this = indexer->indices[tree].node_depths.data();
            n_terminal_this = indexer->indices[tree].n_terminal;
            node_dist_this = indexer->indices[tree].node_distances.data();
            ncomb_this = calc_ncomb(n_terminal_this);
            for (size_t ref = 0; ref < n_ref; ref++)
            {
                i = ind_this[row];
                j = ref_this[ref];

                if (unlikely(i == j))
                    rmat_this[ref] += node_depths_this[i] + 3.;
                else
                    rmat_this[ref] += node_dist_this[ix_comb(i, j, n_terminal_this, ncomb_this)];
            }
        }
    }

    check_interrupt_switch(ss);

    size_t size_rmat = nrows * n_ref;
    if (standardize_dist)
    {
        double ntrees_dbl = (double)ntrees;
        double div_trees = (double)(mult2(ntrees));
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] = std::exp2( - (rmat[ix] - ntrees_dbl) / div_trees);
    }

    else
    {
        double div_trees = (double)ntrees;
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] /= div_trees;
    }

    check_interrupt_switch(ss);
}